

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjbench.c
# Opt level: O3

char * sigfig(double val,int figs,char *buf,int len)

{
  undefined4 in_register_0000003c;
  double dVar1;
  char format [80];
  char local_68 [88];
  
  dVar1 = log10(ABS(val));
  dVar1 = ceil(dVar1);
  if ((int)dVar1 < 4) {
    snprintf(local_68,0x50,"%%.%df",(ulong)(4 - (int)dVar1));
  }
  else {
    snprintf(local_68,0x50,"%%.0f");
  }
  snprintf((char *)CONCAT44(in_register_0000003c,figs),(ulong)buf & 0xffffffff,local_68,val);
  return (char *)CONCAT44(in_register_0000003c,figs);
}

Assistant:

static char *sigfig(double val, int figs, char *buf, int len)
{
  char format[80];
  int digitsAfterDecimal = figs - (int)ceil(log10(fabs(val)));

  if (digitsAfterDecimal < 1)
    snprintf(format, 80, "%%.0f");
  else
    snprintf(format, 80, "%%.%df", digitsAfterDecimal);
  snprintf(buf, len, format, val);
  return buf;
}